

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trap.c
# Opt level: O0

void square_memorize_traps(chunk_conflict2 *c,loc_conflict grid)

{
  _Bool _Var1;
  square_conflict *psVar2;
  trap *ptVar3;
  trap *next;
  trap *current;
  trap *trap;
  chunk_conflict2 *c_local;
  loc_conflict grid_local;
  
  psVar2 = square((chunk *)c,grid);
  current = psVar2->trap;
  next = (trap *)0x0;
  if (c == (chunk_conflict2 *)cave) {
    square_remove_all_traps((chunk_conflict2 *)player->cave,grid);
    psVar2 = square((chunk *)player->cave,grid);
    flag_off(psVar2->info,3,9);
    for (; current != (trap *)0x0; current = current->next) {
      _Var1 = square_isvisibletrap((chunk *)c,grid);
      if (_Var1) {
        if (next == (trap *)0x0) {
          next = (trap *)mem_zalloc(0x28);
          c_local._4_4_ = grid.y;
          c_local._0_4_ = grid.x;
          player->cave->squares[c_local._4_4_][(wchar_t)c_local].trap = next;
        }
        else {
          ptVar3 = (trap *)mem_zalloc(0x28);
          next->next = ptVar3;
          next = ptVar3;
        }
        memcpy(next,current,0x28);
        next->next = (trap *)0x0;
      }
    }
    psVar2 = square((chunk *)player->cave,grid);
    if (psVar2->trap != (trap *)0x0) {
      psVar2 = square((chunk *)player->cave,grid);
      flag_on_dbg(psVar2->info,3,9,"square(player->cave, grid)->info","SQUARE_TRAP");
    }
  }
  return;
}

Assistant:

void square_memorize_traps(struct chunk *c, struct loc grid)
{
	struct trap *trap = square(c, grid)->trap;
	struct trap *current = NULL;
	if (c != cave) return;

	/* Clear current knowledge */
	square_remove_all_traps(player->cave, grid);
	sqinfo_off(square(player->cave, grid)->info, SQUARE_TRAP);

	/* Copy all visible traps to the known cave */
	while (trap) {
		if (square_isvisibletrap(c, grid)) {
			struct trap *next;
			if (current) {
				next = mem_zalloc(sizeof(*next));
				current->next = next;
				current = next;
			} else {
				current = mem_zalloc(sizeof(*current));
				player->cave->squares[grid.y][grid.x].trap = current;
			}
			memcpy(current, trap, sizeof(*trap));
			current->next = NULL;
		}
		trap = trap->next;
	}
	if (square(player->cave, grid)->trap) {
		sqinfo_on(square(player->cave, grid)->info, SQUARE_TRAP);
	}
}